

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage_conversions.cpp
# Opt level: O1

void convert_RGBA64_to_ARGB32<true>(QImageData *dest,QImageData *src,ImageConversionFlags param_3)

{
  int iVar1;
  QRgba64 *src_00;
  uint *d;
  uint *dst;
  
  if (0 < src->height) {
    dst = (uint *)dest->data;
    src_00 = (QRgba64 *)src->data;
    iVar1 = 0;
    do {
      qt_convertRGBA64ToARGB32<true>(dst,src_00,src->width);
      src_00 = (QRgba64 *)((long)&src_00->rgba + src->bytes_per_line);
      dst = (uint *)((long)dst + dest->bytes_per_line);
      iVar1 = iVar1 + 1;
    } while (iVar1 < src->height);
  }
  return;
}

Assistant:

static void convert_RGBA64_to_ARGB32(QImageData *dest, const QImageData *src, Qt::ImageConversionFlags)
{
    Q_ASSERT(src->format == QImage::Format_RGBA64);
    Q_ASSERT(RGBA || dest->format == QImage::Format_ARGB32);
    Q_ASSERT(!RGBA || dest->format == QImage::Format_RGBA8888);
    Q_ASSERT(src->width == dest->width);
    Q_ASSERT(src->height == dest->height);

    const uchar *srcData = src->data;
    uchar *destData = dest->data;

    for (int i = 0; i < src->height; ++i) {
        uint *d = reinterpret_cast<uint *>(destData);
        const QRgba64 *s = reinterpret_cast<const QRgba64 *>(srcData);
        qt_convertRGBA64ToARGB32<RGBA>(d, s, src->width);
        srcData += src->bytes_per_line;
        destData += dest->bytes_per_line;
    }
}